

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operation.cpp
# Opt level: O0

ptr<Value> __thiscall Operation::getResult(Operation *this,ptr<Value> *left,ptr<Value> *right)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ThrowPacket *pTVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  ptr<Value> pVar9;
  allocator<char> local_199;
  string local_198;
  ptr<Value> local_178;
  shared_ptr<Value> local_168;
  shared_ptr<Value> local_158;
  shared_ptr<Value> local_148;
  shared_ptr<Array> local_138;
  shared_ptr<Array> local_128;
  shared_ptr<Value> local_118;
  shared_ptr<Object> local_108;
  shared_ptr<Object> local_f8;
  shared_ptr<Value> local_e8;
  string local_d8 [32];
  string local_b8 [32];
  shared_ptr<Value> local_98;
  Type local_88;
  undefined1 local_82;
  undefined1 local_81;
  Type type;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  ptr<Value> object;
  ptr<Value> *right_local;
  ptr<Value> *left_local;
  Operation *this_local;
  ptr<Value> *result;
  
  object.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RCX;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)right);
  if ((bVar1) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         object.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi), bVar1)) {
    local_82 = 0;
    std::shared_ptr<Value>::shared_ptr((shared_ptr<Value> *)this);
    local_88 = getGreaterType(right,(ptr<Value> *)
                                    object.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi);
    switch(local_88) {
    case String:
      peVar7 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          right);
      (*(peVar7->super_Member)._vptr_Member[2])(local_b8);
      peVar7 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          object.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi);
      (*(peVar7->super_Member)._vptr_Member[2])(local_d8);
      (*(code *)(((left->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_Member)._vptr_Member)(&local_98,left,local_b8,local_d8);
      std::shared_ptr<Value>::operator=((shared_ptr<Value> *)this,&local_98);
      std::shared_ptr<Value>::~shared_ptr(&local_98);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_b8);
      _Var8._M_pi = extraout_RDX;
      break;
    case Double:
      peVar7 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          right);
      (*(peVar7->super_Member)._vptr_Member[4])();
      peVar7 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          object.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi);
      (*(peVar7->super_Member)._vptr_Member[4])();
      (*(code *)(left->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].super_Member
                ._vptr_Member)(extraout_XMM0_Qa,extraout_XMM0_Qa_00,&local_148);
      std::shared_ptr<Value>::operator=((shared_ptr<Value> *)this,&local_148);
      std::shared_ptr<Value>::~shared_ptr(&local_148);
      _Var8._M_pi = extraout_RDX_02;
      break;
    case Integer:
      peVar7 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          right);
      iVar2 = (*(peVar7->super_Member)._vptr_Member[3])();
      peVar7 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          object.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi);
      iVar3 = (*(peVar7->super_Member)._vptr_Member[3])();
      (*(code *)(left->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[2].super_Member
                ._vptr_Member)(&local_158,left,iVar2,iVar3);
      std::shared_ptr<Value>::operator=((shared_ptr<Value> *)this,&local_158);
      std::shared_ptr<Value>::~shared_ptr(&local_158);
      _Var8._M_pi = extraout_RDX_03;
      break;
    case Boolean:
      peVar7 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          right);
      uVar4 = (*(peVar7->super_Member)._vptr_Member[5])();
      peVar7 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          object.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi);
      uVar5 = (*(peVar7->super_Member)._vptr_Member[5])();
      (*(code *)(left->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[3].super_Member
                ._vptr_Member)(&local_168,left,uVar4 & 1,uVar5 & 1);
      std::shared_ptr<Value>::operator=((shared_ptr<Value> *)this,&local_168);
      std::shared_ptr<Value>::~shared_ptr(&local_168);
      _Var8._M_pi = extraout_RDX_04;
      break;
    case Object:
      peVar7 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          right);
      (*(peVar7->super_Member)._vptr_Member[6])(&local_f8);
      peVar7 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          object.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi);
      (*(peVar7->super_Member)._vptr_Member[6])(&local_108);
      (*(code *)(left->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[4].super_Member
                ._vptr_Member)(&local_e8,left,&local_f8,&local_108);
      std::shared_ptr<Value>::operator=((shared_ptr<Value> *)this,&local_e8);
      std::shared_ptr<Value>::~shared_ptr(&local_e8);
      std::shared_ptr<Object>::~shared_ptr(&local_108);
      std::shared_ptr<Object>::~shared_ptr(&local_f8);
      _Var8._M_pi = extraout_RDX_00;
      break;
    case Array:
      peVar7 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          right);
      (*(peVar7->super_Member)._vptr_Member[7])(&local_128);
      peVar7 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          object.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi);
      (*(peVar7->super_Member)._vptr_Member[7])(&local_138);
      (*(code *)(left->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[5].super_Member
                ._vptr_Member)(&local_118,left,&local_128,&local_138);
      std::shared_ptr<Value>::operator=((shared_ptr<Value> *)this,&local_118);
      std::shared_ptr<Value>::~shared_ptr(&local_118);
      std::shared_ptr<Array>::~shared_ptr(&local_138);
      std::shared_ptr<Array>::~shared_ptr(&local_128);
      _Var8._M_pi = extraout_RDX_01;
      break;
    default:
      pTVar6 = (ThrowPacket *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"Types are not operable!",&local_199);
      ExceptionObjects::undefined_operation((ExceptionObjects *)&local_178,&local_198);
      ThrowPacket::ThrowPacket(pTVar6,&local_178);
      __cxa_throw(pTVar6,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
    }
    pVar9.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
    pVar9.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (ptr<Value>)pVar9.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Both operands must have a value",&local_59);
  ExceptionObjects::null_value((ExceptionObjects *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_81 = 1;
  pTVar6 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::shared_ptr<Value>::shared_ptr((shared_ptr<Value> *)&type,(shared_ptr<Value> *)local_38);
  ThrowPacket::ThrowPacket(pTVar6,(shared_ptr<Value> *)&type);
  local_81 = 0;
  __cxa_throw(pTVar6,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
}

Assistant:

ptr<Value> Operation::getResult(ptr<Value> &left, ptr<Value> &right) {
    if(!left || !right) {
        ptr<Value> object = ExceptionObjects::null_value("Both operands must have a value");
        throw ThrowPacket(object);
    }

    ptr<Value> result;
    Type type = getGreaterType(left, right);

    switch(type) {
        case Type::String:
            result = asStrings(left -> asString(), right -> asString());
            break;
        case Type::Object:
            result = asObjects(left -> asObject(), right -> asObject());
            break;
        case Type::Array:
            result = asArrays(left -> asArray(), right -> asArray());
            break;
        case Type::Double:
            result = asDoubles(left -> asDouble(), right -> asDouble());
            break;
        case Type::Integer:
            result = asIntegers(left -> asInteger(), right -> asInteger());
            break;
        case Type::Boolean:
            result = asBooleans(left -> asBoolean(), right -> asBoolean());
            break;
        default:
            throw ThrowPacket(ExceptionObjects::undefined_operation("Types are not operable!"));
    }
    return result;
}